

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int glist_selectionindex(_glist *x,t_gobj *y,int selected)

{
  int iVar1;
  int local_2c;
  t_gobj *ptStack_28;
  int indx;
  t_gobj *y2;
  int selected_local;
  t_gobj *y_local;
  _glist *x_local;
  
  ptStack_28 = x->gl_list;
  local_2c = 0;
  for (; ptStack_28 != (t_gobj *)0x0 && ptStack_28 != y; ptStack_28 = ptStack_28->g_next) {
    iVar1 = glist_isselected(x,ptStack_28);
    if (selected == iVar1) {
      local_2c = local_2c + 1;
    }
  }
  return local_2c;
}

Assistant:

int glist_selectionindex(t_glist *x, t_gobj *y, int selected)
{
    t_gobj *y2;
    int indx;

    for (y2 = x->gl_list, indx = 0; y2 && y2 != y; y2 = y2->g_next)
        if (selected == glist_isselected(x, y2))
            indx++;
    return (indx);
}